

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

Vec<Hpipe::Lexer::TrainingData> * __thiscall
Hpipe::Lexer::training_data(Vec<Hpipe::Lexer::TrainingData> *__return_storage_ptr__,Lexer *this)

{
  int iVar1;
  double dVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  istream *piVar7;
  long *plVar8;
  int *piVar9;
  undefined8 uVar10;
  long *plVar11;
  ulong uVar12;
  Lexem *pLVar13;
  int iVar14;
  string freq;
  string line;
  TrainingData td;
  istringstream is;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  int local_270;
  allocator local_269;
  char *local_268;
  undefined8 local_260;
  char local_258;
  undefined7 uStack_257;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  vector<Hpipe::Lexer::TrainingData,std::allocator<Hpipe::Lexer::TrainingData>> *local_228;
  Lexer *local_220;
  TrainingData local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  long local_1b0 [15];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->
  super_vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>).
  super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>).
  super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>).
  super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar13 = (this->first_item).next;
  if (pLVar13 == (Lexem *)0x0) {
    return __return_storage_ptr__;
  }
  local_228 = (vector<Hpipe::Lexer::TrainingData,std::allocator<Hpipe::Lexer::TrainingData>> *)
              __return_storage_ptr__;
  local_220 = this;
LAB_001768cd:
  local_268 = &local_258;
  if (pLVar13->type == TRAINING) {
    local_218.name._M_dataplus._M_p = (pointer)&local_218.name.field_2;
    local_218.name._M_string_length = 0;
    local_218.name.field_2._M_local_buf[0] = '\0';
    local_218.inp._M_dataplus._M_p = (pointer)&local_218.inp.field_2;
    local_218.inp._M_string_length = 0;
    local_218.inp.field_2._M_local_buf[0] = '\0';
    local_260 = 0;
    local_258 = '\0';
    std::__cxx11::string::substr((ulong)&local_248,(ulong)&pLVar13->str);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1b0,(string *)&local_248,_S_in);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,
                      CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                               local_248.field_2._M_local_buf[0]) + 1);
    }
    cVar3 = std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) +
                            (char)(istringstream *)local_1b0);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_1b0,(string *)&local_218,cVar3);
    while ((local_218.name._M_string_length != 0 && (*local_218.name._M_dataplus._M_p == ' '))) {
      std::__cxx11::string::substr((ulong)&local_248,(ulong)&local_218);
      std::__cxx11::string::operator=((string *)&local_218,(string *)&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                 local_248.field_2._M_local_buf[0]) + 1);
      }
    }
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    local_248._M_string_length = 0;
    local_248.field_2._M_local_buf[0] = '\0';
    local_270 = 0;
    iVar1 = 0;
    iVar6 = 0;
LAB_00176a1c:
    iVar14 = iVar6;
    iVar4 = iVar1;
    cVar3 = std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) + (char)(istream *)local_1b0
                           );
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b0,(string *)&local_248,cVar3);
    if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) goto LAB_00176f6e;
    iVar1 = iVar4;
    iVar6 = iVar14;
    if (local_248._M_string_length < 4) goto LAB_00176ac0;
    std::__cxx11::string::substr((ulong)&local_290,(ulong)&local_248);
    iVar5 = std::__cxx11::string::compare((char *)&local_290);
    if (local_290 != &local_280) {
      operator_delete(local_290,local_280 + 1);
    }
    if (iVar5 != 0) goto LAB_00176ac0;
    if (local_248._M_string_length < 8) {
LAB_00176bb4:
      if (6 < local_248._M_string_length) {
        std::__cxx11::string::substr((ulong)&local_290,(ulong)&local_248);
        iVar5 = std::__cxx11::string::compare((char *)&local_290);
        if (local_290 != &local_280) {
          operator_delete(local_290,local_280 + 1);
        }
        iVar6 = 1;
        if (iVar5 == 0) goto LAB_00176a1c;
        if (7 < local_248._M_string_length) {
          std::__cxx11::string::substr((ulong)&local_290,(ulong)&local_248);
          iVar5 = std::__cxx11::string::compare((char *)&local_290);
          if (local_290 != &local_280) {
            operator_delete(local_290,local_280 + 1);
          }
          iVar6 = 2;
          if (iVar5 == 0) goto LAB_00176a1c;
        }
      }
      if (local_248._M_string_length != 0) {
        uVar12 = 0;
        do {
          if (local_248._M_dataplus._M_p[uVar12] != ' ') {
            std::operator+(&local_1d0,"Unknown test command \'",&local_248);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_1d0);
            plVar11 = plVar8 + 2;
            if ((long *)*plVar8 == plVar11) {
              local_280 = *plVar11;
              lStack_278 = plVar8[3];
              local_290 = &local_280;
            }
            else {
              local_280 = *plVar11;
              local_290 = (long *)*plVar8;
            }
            local_288 = plVar8[1];
            *plVar8 = (long)plVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            ErrorList::add(local_220->error_list,pLVar13->source,pLVar13->beg,(char *)local_290);
            if (local_290 != &local_280) {
              operator_delete(local_290,local_280 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            goto LAB_00176f6e;
          }
          uVar12 = uVar12 + 1;
        } while (local_248._M_string_length != uVar12);
      }
      if (iVar14 == 2) {
        if (local_270 != 0) {
          std::__cxx11::string::push_back((char)&local_268);
        }
        std::__cxx11::string::substr((ulong)&local_290,(ulong)&local_248);
        std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_290);
        goto LAB_00176d36;
      }
      iVar6 = iVar14;
      if (iVar14 == 1) {
        iVar1 = 1;
        iVar6 = 1;
        if (iVar4 != 0) {
          std::__cxx11::string::push_back((char)&local_218 + '(');
          iVar1 = iVar4 + 1;
        }
      }
      goto LAB_00176a1c;
    }
    std::__cxx11::string::substr((ulong)&local_290,(ulong)&local_248);
    iVar6 = std::__cxx11::string::compare((char *)&local_290);
    if (local_290 != &local_280) {
      operator_delete(local_290,local_280 + 1);
    }
    if (iVar6 != 0) goto LAB_00176bb4;
    if (iVar14 == 0) {
      ErrorList::add(local_220->error_list,pLVar13->source,pLVar13->beg,
                     "String inside test must have spaces at the beginning: 1 space for command names, at least 2 for command data"
                    );
      iVar6 = 0;
      goto LAB_00176a1c;
    }
    if (iVar14 == 1) {
      if (iVar4 != 0) {
        std::__cxx11::string::push_back((char)&local_218 + '(');
      }
      std::__cxx11::string::substr((ulong)&local_290,(ulong)&local_248);
      std::__cxx11::string::_M_append((char *)&local_218.inp,(ulong)local_290);
      if (local_290 != &local_280) {
        operator_delete(local_290,local_280 + 1);
      }
      iVar1 = iVar4 + 1;
      iVar6 = 1;
      goto LAB_00176a1c;
    }
    if (local_270 != 0) {
      std::__cxx11::string::push_back((char)&local_268);
    }
    std::__cxx11::string::substr((ulong)&local_290,(ulong)&local_248);
    std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_290);
    goto LAB_00176d36;
  }
  goto LAB_001770a8;
LAB_00176ac0:
  if (local_248._M_string_length != 0) {
    uVar12 = 0;
    do {
      if (local_248._M_dataplus._M_p[uVar12] != ' ') {
        ErrorList::add(local_220->error_list,pLVar13->source,pLVar13->beg,
                       "String inside test must have spaces at the beginning: 4 spaces for command names, at least 8 for command data"
                      );
        goto LAB_00176a1c;
      }
      uVar12 = uVar12 + 1;
    } while (local_248._M_string_length != uVar12);
  }
  if (iVar14 != 2) {
    if (iVar14 == 1) {
      iVar1 = 1;
      iVar6 = 1;
      if (iVar4 != 0) {
        std::__cxx11::string::push_back((char)&local_218 + '(');
        iVar1 = iVar4 + 1;
      }
    }
    goto LAB_00176a1c;
  }
  if (local_270 != 0) {
    std::__cxx11::string::push_back((char)&local_268);
  }
  std::__cxx11::string::substr((ulong)&local_290,(ulong)&local_248);
  std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_290);
LAB_00176d36:
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  local_270 = local_270 + 1;
  iVar6 = 2;
  goto LAB_00176a1c;
LAB_00176f6e:
  std::__cxx11::string::string((string *)&local_290,local_268,&local_269);
  plVar8 = local_290;
  piVar9 = __errno_location();
  iVar1 = *piVar9;
  *piVar9 = 0;
  dVar2 = strtod((char *)plVar8,(char **)&local_1d0);
  if ((long *)local_1d0._M_dataplus._M_p == plVar8) {
    std::__throw_invalid_argument("stod");
LAB_001770d8:
    uVar10 = std::__throw_out_of_range("stod");
    if (local_290 != &local_280) {
      operator_delete(local_290,local_280 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,
                      CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                               local_248.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
    std::ios_base::~ios_base(local_138);
    if (local_268 != &local_258) {
      operator_delete(local_268,CONCAT71(uStack_257,local_258) + 1);
    }
    TrainingData::~TrainingData(&local_218);
    std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>::~vector
              ((vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_> *)
               local_228);
    _Unwind_Resume(uVar10);
  }
  if (*piVar9 == 0) {
    *piVar9 = iVar1;
  }
  else if (*piVar9 == 0x22) goto LAB_001770d8;
  local_218.freq = dVar2;
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  std::vector<Hpipe::Lexer::TrainingData,std::allocator<Hpipe::Lexer::TrainingData>>::
  emplace_back<Hpipe::Lexer::TrainingData_const&>(local_228,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  if (local_268 != &local_258) {
    operator_delete(local_268,CONCAT71(uStack_257,local_258) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.inp._M_dataplus._M_p != &local_218.inp.field_2) {
    operator_delete(local_218.inp._M_dataplus._M_p,
                    CONCAT71(local_218.inp.field_2._M_allocated_capacity._1_7_,
                             local_218.inp.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.name._M_dataplus._M_p != &local_218.name.field_2) {
    operator_delete(local_218.name._M_dataplus._M_p,
                    CONCAT71(local_218.name.field_2._M_allocated_capacity._1_7_,
                             local_218.name.field_2._M_local_buf[0]) + 1);
  }
LAB_001770a8:
  pLVar13 = pLVar13->next;
  if (pLVar13 == (Lexem *)0x0) {
    return (Vec<Hpipe::Lexer::TrainingData> *)local_228;
  }
  goto LAB_001768cd;
}

Assistant:

const Lexem *Lexer::find_machine( const std::string &name) const {
    const Lexem *margs;
    return find_machine( margs, name );
}